

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  ushort uVar5;
  short sVar6;
  uint uVar7;
  short sVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint *z;
  undefined1 auVar13 [16];
  DateTime x;
  undefined1 local_68;
  uint local_67;
  undefined1 local_63;
  char local_62;
  char local_61;
  undefined1 local_60;
  char local_5f;
  char local_5e;
  undefined1 local_5d;
  char local_5c;
  char local_5b;
  undefined1 local_5a;
  char local_59;
  char local_58;
  undefined1 local_57;
  char local_56;
  char local_55;
  undefined1 local_54;
  char local_53;
  char local_52;
  char local_51;
  undefined1 local_50;
  DateTime local_40;
  byte bVar2;
  char cVar3;
  char cVar4;
  
  z = (uint *)&local_68;
  iVar9 = isDate(context,argc,argv,&local_40);
  if (iVar9 == 0) {
    computeYMD(&local_40);
    computeHMS(&local_40);
    uVar7 = -local_40.Y;
    if (0 < local_40.Y) {
      uVar7 = local_40.Y;
    }
    auVar13._0_4_ = (uVar7 / 1000) % 10;
    auVar13._4_4_ = (uVar7 / 100) % 10;
    auVar13._8_4_ = (uVar7 / 10) % 10;
    auVar13._12_4_ = uVar7 % 10;
    auVar13 = auVar13 & _DAT_001c0610;
    uVar5 = auVar13._0_2_;
    bVar1 = (uVar5 != 0) * (uVar5 < 0x100) * auVar13[0] - (0xff < uVar5);
    uVar5 = auVar13._4_2_;
    bVar2 = (uVar5 != 0) * (uVar5 < 0x100) * auVar13[4] - (0xff < uVar5);
    sVar6 = auVar13._8_2_;
    cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar13[8] - (0xff < sVar6);
    sVar6 = auVar13._10_2_;
    sVar8 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar13[10] - (0xff < sVar6),cVar3);
    sVar6 = auVar13._12_2_;
    cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar13[0xc] - (0xff < sVar6);
    sVar6 = auVar13._14_2_;
    sVar6 = (short)(CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar13[0xe] - (0xff < sVar6),
                             CONCAT12(cVar4,sVar8)) >> 0x10);
    local_67 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * cVar4 - (0xff < sVar6),
                        CONCAT12((0 < sVar8) * (sVar8 < 0x100) * cVar3 - (0xff < sVar8),
                                 CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                          (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1))))
               | (uint)DAT_001c0620;
    local_63 = 0x2d;
    cVar4 = (char)(local_40.M / 10);
    local_62 = cVar4 + (char)((local_40.M / 10) / 10) * -10 + '0';
    local_61 = (char)local_40.M + cVar4 * -10 + '0';
    local_60 = 0x2d;
    cVar4 = (char)(local_40.D / 10);
    local_5f = cVar4 + (char)((local_40.D / 10) / 10) * -10 + '0';
    local_5e = (char)local_40.D + cVar4 * -10 + '0';
    local_5d = 0x20;
    cVar4 = (char)(local_40.h / 10);
    local_5c = cVar4 + (char)((local_40.h / 10) / 10) * -10 + '0';
    local_5b = (char)local_40.h + cVar4 * -10 + '0';
    local_5a = 0x3a;
    cVar4 = (char)(local_40.m / 10);
    local_59 = cVar4 + (char)((local_40.m / 10) / 10) * -10 + '0';
    local_58 = (char)local_40.m + cVar4 * -10 + '0';
    local_57 = 0x3a;
    if ((local_40._44_1_ & 4) == 0) {
      iVar12 = (int)local_40.s;
      iVar9 = iVar12 / 10;
      iVar11 = 0x14;
      local_54 = 0;
    }
    else {
      iVar10 = (int)(local_40.s * 1000.0 + 0.5);
      iVar9 = iVar10 / 10000;
      iVar12 = iVar10 / 1000;
      iVar11 = iVar10 / 100;
      local_53 = (char)iVar11 +
                 ((char)(uint)((ulong)((long)iVar11 * 0x66666667) >> 0x22) - (char)(iVar11 >> 0x1f))
                 * -10 + '0';
      iVar11 = iVar10 / 10;
      local_52 = (char)iVar11 +
                 ((char)(uint)((ulong)((long)iVar11 * 0x66666667) >> 0x22) - (char)(iVar11 >> 0x1f))
                 * -10 + '0';
      local_51 = (char)iVar10 + (char)iVar11 * -10 + '0';
      local_50 = 0;
      iVar11 = 0x18;
      local_54 = 0x2e;
    }
    local_55 = (char)iVar12 + (char)(iVar12 / 10) * -10 + '0';
    local_56 = (char)iVar9 + (char)(iVar9 / 10) * -10 + '0';
    if (local_40.Y < 0) {
      local_68 = 0x2d;
    }
    else {
      z = &local_67;
      iVar11 = iVar11 + -1;
    }
    setResultStrOrError(context,(char *)z,iVar11,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y, s, n;
    char zBuf[32];
    computeYMD_HMS(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = ' ';
    zBuf[12] = '0' + (x.h/10)%10;
    zBuf[13] = '0' + (x.h)%10;
    zBuf[14] = ':';
    zBuf[15] = '0' + (x.m/10)%10;
    zBuf[16] = '0' + (x.m)%10;
    zBuf[17] = ':';
    if( x.useSubsec ){
      s = (int)(1000.0*x.s + 0.5);
      zBuf[18] = '0' + (s/10000)%10;
      zBuf[19] = '0' + (s/1000)%10;
      zBuf[20] = '.';
      zBuf[21] = '0' + (s/100)%10;
      zBuf[22] = '0' + (s/10)%10;
      zBuf[23] = '0' + (s)%10;
      zBuf[24] = 0;
      n = 24;
    }else{
      s = (int)x.s;
      zBuf[18] = '0' + (s/10)%10;
      zBuf[19] = '0' + (s)%10;
      zBuf[20] = 0;
      n = 20;
    }
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, n, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], n-1, SQLITE_TRANSIENT);
    }
  }
}